

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::Tracer_testTracerSpanSelfRefWithOtherRefs_Test::TestBody
          (Tracer_testTracerSpanSelfRefWithOtherRefs_Test *this)

{
  long *plVar1;
  element_type *peVar2;
  Span *span;
  SpanContext *pSVar3;
  char *pcVar4;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>
  option_list_00;
  long *local_398;
  AssertionResult gtest_ar__1;
  AssertHelper local_370 [8];
  long *local_368;
  TraceID local_360;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_350;
  shared_ptr<jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  SpanContext spanSelfContext2;
  Span jaegerSpanRoot;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_240;
  __node_base local_238;
  size_type sStack_230;
  _Prime_rehash_policy local_228;
  __node_base_ptr ap_Stack_218 [40];
  SpanContext spanSelfContext;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)&tracer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_240);
  local_350._M_buckets = (__buckets_ptr)0x1;
  local_350._M_bucket_count = 2;
  _jaegerSpanRoot = ap_Stack_218;
  local_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_238._M_nxt = (_Hash_node_base *)0x0;
  sStack_230 = 0;
  local_228._M_max_load_factor = 1.0;
  local_228._4_4_ = 0;
  local_228._M_next_resize = 0;
  ap_Stack_218[0] = (__node_base_ptr)0x0;
  pcVar4 = "";
  std::__cxx11::string::string((string *)&spanSelfContext2,"",(allocator *)&gtest_ar__1);
  SpanContext::SpanContext
            (&spanSelfContext,(TraceID *)&local_350,3,0,'\0',(StrMap *)&jaegerSpanRoot,
             (string *)&spanSelfContext2);
  std::__cxx11::string::~string((string *)&spanSelfContext2);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&jaegerSpanRoot);
  peVar2 = tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  jaegertracing::SelfRef((SpanContext *)&jaegerSpanRoot);
  operation_name.length_ = (size_t)"test-root-self-ref";
  operation_name.data_ = (char *)peVar2;
  option_list._M_len = (size_type)&spanSelfContext2;
  option_list._M_array = (iterator)0x12;
  spanSelfContext2.super_SpanContext._vptr_SpanContext = (_func_int **)&jaegerSpanRoot;
  opentracing::v3::Tracer::StartSpan((Tracer *)&local_398,operation_name,option_list);
  spanSelfContext2._traceID._high = 0;
  spanSelfContext2.super_SpanContext._vptr_SpanContext._0_1_ = local_398 != (long *)0x0;
  if (local_398 == (long *)0x0) {
    testing::Message::Message((Message *)&local_350);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&jaegerSpanRoot,(char *)&spanSelfContext2,"spanRoot","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x21d,(char *)_jaegerSpanRoot);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&jaegerSpanRoot);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&spanSelfContext2._traceID);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&spanSelfContext2._traceID);
    span = (Span *)__dynamic_cast(local_398,&opentracing::v3::Span::typeinfo,&Span::typeinfo,0);
    if (span == (Span *)0x0) {
      __cxa_bad_cast();
    }
    Span::Span(&jaegerSpanRoot,span);
    pSVar3 = Span::context(&jaegerSpanRoot);
    local_350._M_buckets = (__buckets_ptr)0x1;
    local_350._M_bucket_count = 2;
    testing::internal::CmpHelperEQ<jaegertracing::TraceID,jaegertracing::TraceID>
              ((internal *)&spanSelfContext2,"jaegerSpanRoot.context().traceID()",
               "jaegertracing::TraceID(1, 2)",&pSVar3->_traceID,(TraceID *)&local_350);
    if ((char)spanSelfContext2.super_SpanContext._vptr_SpanContext == '\0') {
      testing::Message::Message((Message *)&local_350);
      if (spanSelfContext2._traceID._high != 0) {
        pcVar4 = *(char **)spanSelfContext2._traceID._high;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x21f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&local_350)
      ;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&spanSelfContext2._traceID);
      pSVar3 = Span::context(&jaegerSpanRoot);
      local_350._M_buckets = (__buckets_ptr)pSVar3->_spanID;
      gtest_ar__1.success_ = true;
      gtest_ar__1._1_3_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&spanSelfContext2,"jaegerSpanRoot.context().spanID()","3",
                 (unsigned_long *)&local_350,(int *)&gtest_ar__1);
      if ((char)spanSelfContext2.super_SpanContext._vptr_SpanContext != '\0') {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&spanSelfContext2._traceID);
        local_350._M_buckets = &local_350._M_single_bucket;
        local_360._high = 1;
        local_360._low = 2;
        local_350._M_bucket_count = 1;
        local_350._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_350._M_element_count = 0;
        local_350._M_rehash_policy._M_max_load_factor = 1.0;
        local_350._M_rehash_policy._4_4_ = 0;
        local_350._M_rehash_policy._M_next_resize = 0;
        local_350._M_single_bucket = (__node_base_ptr)0x0;
        std::__cxx11::string::string((string *)&gtest_ar__1,"",(allocator *)&local_368);
        SpanContext::SpanContext
                  (&spanSelfContext2,&local_360,4,0,'\0',(StrMap *)&local_350,(string *)&gtest_ar__1
                  );
        std::__cxx11::string::~string((string *)&gtest_ar__1);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_350);
        peVar2 = tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_350._M_before_begin._M_nxt = (_Hash_node_base *)(**(code **)(*local_398 + 0x50))();
        local_350._M_buckets = (__buckets_ptr)&PTR__StartSpanOption_0021f2b8;
        local_350._M_bucket_count = CONCAT44(local_350._M_bucket_count._4_4_,1);
        local_360._high = (uint64_t)&local_350;
        jaegertracing::SelfRef((SpanContext *)&gtest_ar__1);
        operation_name_00.length_ = (size_t)"test-child-self-ref";
        operation_name_00.data_ = (char *)peVar2;
        option_list_00._M_len = (size_type)&local_360;
        option_list_00._M_array = (iterator)0x13;
        local_360._low = (uint64_t)&gtest_ar__1;
        opentracing::v3::Tracer::StartSpan((Tracer *)&local_368,operation_name_00,option_list_00);
        plVar1 = local_368;
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar__1.success_ = local_368 == (long *)0x0;
        if (local_368 != (long *)0x0) {
          testing::Message::Message((Message *)&local_360);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&local_350,&gtest_ar__1.success_,"spanChild","true");
          testing::internal::AssertHelper::AssertHelper
                    (local_370,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x226,(char *)local_350._M_buckets);
          testing::internal::AssertHelper::operator=(local_370,(Message *)&local_360);
          testing::internal::AssertHelper::~AssertHelper(local_370);
          std::__cxx11::string::~string((string *)&local_350);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_360);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__1.message_);
        if (local_368 != (long *)0x0) {
          (**(code **)(*local_368 + 8))();
        }
        SpanContext::~SpanContext(&spanSelfContext2);
        Span::~Span(&jaegerSpanRoot);
        if (local_398 != (long *)0x0) {
          (**(code **)(*local_398 + 8))();
        }
        SpanContext::~SpanContext(&spanSelfContext);
        if (plVar1 == (long *)0x0) {
          (**(code **)(*(long *)tracer.
                                super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 0x58))();
        }
        goto LAB_001ac17e;
      }
      testing::Message::Message((Message *)&local_350);
      if (spanSelfContext2._traceID._high == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)spanSelfContext2._traceID._high;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x220,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&local_350)
      ;
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&spanSelfContext2._traceID);
    Span::~Span(&jaegerSpanRoot);
  }
  if (local_398 != (long *)0x0) {
    (**(code **)(*local_398 + 8))();
  }
  SpanContext::~SpanContext(&spanSelfContext);
LAB_001ac17e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&handle.
              super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST(Tracer, testTracerSpanSelfRefWithOtherRefs)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        const jaegertracing::SpanContext spanSelfContext { {1, 2}, 3, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanRoot = tracer->StartSpan("test-root-self-ref", {jaegertracing::SelfRef(&spanSelfContext)});
        ASSERT_TRUE(spanRoot);
        auto jaegerSpanRoot = dynamic_cast<jaegertracing::Span&>(*spanRoot.get());
        ASSERT_EQ(jaegerSpanRoot.context().traceID(), jaegertracing::TraceID(1, 2));
        ASSERT_EQ(jaegerSpanRoot.context().spanID(), 3);

        const jaegertracing::SpanContext spanSelfContext2 { {1, 2}, 4, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanChild = tracer->StartSpan("test-child-self-ref",
            { opentracing::ChildOf(&spanRoot->context()), jaegertracing::SelfRef(&spanSelfContext2) }
        );
        ASSERT_FALSE(spanChild);
    }
    tracer->Close();
}